

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::LineInterpolationTest::iterate(LineInterpolationTest *this)

{
  int iVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  size_type sVar4;
  reference pvVar5;
  PixelFormat *pPVar6;
  bool bVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  MessageBuilder local_868;
  allocator<char> local_6e1;
  string local_6e0;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  MessageBuilder local_670;
  allocator<char> local_4e9;
  string local_4e8;
  LineInterpolationMethod local_4c4;
  undefined1 local_4c0 [4];
  LineInterpolationMethod iterationResult;
  LineSceneSpec scene;
  RasterizationArguments args;
  int local_304;
  undefined1 local_300 [4];
  int vtxNdx;
  undefined1 local_180 [8];
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> lines;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  float lineWidth;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  ScopedLogSection local_d8;
  ScopedLogSection section;
  int local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string iterationDescription;
  LineInterpolationTest *this_local;
  
  local_9c = this->m_iteration + 1;
  iterationDescription.field_2._8_8_ = this;
  de::toString<int>(&local_98,&local_9c);
  std::operator+(&local_78,"Test iteration ",&local_98);
  std::operator+(&local_58,&local_78," / ");
  de::toString<int>((string *)&section,&this->m_iterationCount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  pTVar2 = tcu::TestContext::getLog
                     ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  resultImage.m_pixels.m_cap._4_4_ = this->m_iteration + 1;
  de::toString<int>((string *)&lineWidth,(int *)((long)&resultImage.m_pixels.m_cap + 4));
  std::operator+(&local_f8,"Iteration",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineWidth);
  tcu::ScopedLogSection::ScopedLogSection(&local_d8,pTVar2,&local_f8,(string *)local_38);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&lineWidth);
  (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
            ();
  iVar1 = (this->super_BaseRenderingCase).m_renderSize;
  resultImage.m_pixels.m_cap._0_4_ = extraout_XMM0_Da;
  tcu::Surface::Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,iVar1,iVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &lines.
              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::vector
            ((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              *)local_180);
  if (this->m_maxLineWidth < (float)resultImage.m_pixels.m_cap) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx);
    tcu::TestLog::operator<<(&local_868,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_868,(char (*) [12])"Line width ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)&resultImage.m_pixels.m_cap);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [36])" not supported, skipping iteration.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_868);
  }
  else {
    generateVertices(this,this->m_iteration,
                     (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     &colorBuffer.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     &lines.
                      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    extractLines(this,(vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                       *)local_180,
                 (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &colorBuffer.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &lines.
                  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_300,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_300,(char (*) [20])"Generated vertices:");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_300);
    for (local_304 = 0;
        sVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                          ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )&colorBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage),
        local_304 < (int)sVar4; local_304 = local_304 + 1) {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&args.greenBits,pTVar2,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&args.greenBits,(char (*) [2])0x2b88b2a);
      pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          &colorBuffer.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_304);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,pvVar5);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [10])",\tcolor= ");
      pvVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          &lines.
                           super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_304);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,pvVar5);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&args.greenBits);
    }
    BaseRenderingCase::drawPrimitives
              (&this->super_BaseRenderingCase,
               (Surface *)
               &drawBuffer.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &colorBuffer.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &lines.
                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               *(GLenum *)&(this->super_BaseRenderingCase).field_0xc4);
    tcu::LineSceneSpec::LineSceneSpec((LineSceneSpec *)local_4c0);
    scene._28_4_ = (this->super_BaseRenderingCase).m_numSamples;
    pPVar6 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
    args.numSamples = pPVar6->redBits;
    pPVar6 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
    args.subpixelBits = pPVar6->greenBits;
    pPVar6 = BaseRenderingCase::getPixelFormat(&this->super_BaseRenderingCase);
    args.redBits = pPVar6->blueBits;
    std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::swap
              ((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                *)local_4c0,
               (vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                *)local_180);
    (*(this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5]
    )();
    scene.lines.
    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = extraout_XMM0_Da_00;
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode
                        .m_testCtx);
    local_4c4 = tcu::verifyLineGroupInterpolation
                          ((Surface *)
                           &drawBuffer.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (LineSceneSpec *)local_4c0,(RasterizationArguments *)&scene.field_0x1c,
                           pTVar2);
    if (local_4c4 == LINEINTERPOLATION_STRICTLY_CORRECT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"Pass",&local_4e9);
      tcu::ResultCollector::addResult(&this->m_result,QP_TEST_RESULT_PASS,&local_4e8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::allocator<char>::~allocator(&local_4e9);
    }
    else if (local_4c4 == LINEINTERPOLATION_PROJECTED) {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_670,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_670,
                          (char (*) [178])
                          "Interpolation was calculated using coordinates projected onto major axis. This method does not produce the same values as the non-projecting method defined in the specification."
                         );
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_670);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_690,"Interpolation was calculated using projected coordinateds",
                 &local_691);
      tcu::ResultCollector::addResult(&this->m_result,QP_TEST_RESULT_QUALITY_WARNING,&local_690);
      std::__cxx11::string::~string((string *)&local_690);
      std::allocator<char>::~allocator(&local_691);
    }
    else if (local_4c4 == LINEINTERPOLATION_INCORRECT) {
      if (((scene.lines.
            super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ == 1.0) &&
          (!NAN(scene.lines.
                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_))) ||
         ((this->super_BaseRenderingCase).m_numSamples < 2)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6e0,"Found invalid pixel values",&local_6e1);
        tcu::ResultCollector::addResult(&this->m_result,QP_TEST_RESULT_FAIL,&local_6e0);
        std::__cxx11::string::~string((string *)&local_6e0);
        std::allocator<char>::~allocator(&local_6e1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6b8,"Interpolation of multisampled wide lines failed",&local_6b9
                  );
        tcu::ResultCollector::addResult
                  (&this->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,&local_6b8);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::allocator<char>::~allocator(&local_6b9);
      }
    }
    tcu::LineSceneSpec::~LineSceneSpec((LineSceneSpec *)local_4c0);
  }
  iVar1 = this->m_iteration + 1;
  this->m_iteration = iVar1;
  bVar7 = iVar1 != this->m_iterationCount;
  if (!bVar7) {
    tcu::ResultCollector::setTestContextResult
              (&this->m_result,
               (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
  }
  this_local._4_4_ = (IterateResult)bVar7;
  std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
  ~vector((vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> *)
          local_180);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &lines.
              super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &colorBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::ScopedLogSection::~ScopedLogSection(&local_d8);
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

LineInterpolationTest::IterateResult LineInterpolationTest::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<tcu::Vec4>					colorBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// generate scene
		generateVertices(m_iteration, drawBuffer, colorBuffer);
		extractLines(lines, drawBuffer, colorBuffer);

		// log
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
			for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
				m_testCtx.getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
		}

		// draw image
		drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitive);

		// compare
		{
			RasterizationArguments	args;
			LineSceneSpec			scene;
			LineInterpolationMethod	iterationResult;

			args.numSamples		= m_numSamples;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= getPixelFormat().redBits;
			args.greenBits		= getPixelFormat().greenBits;
			args.blueBits		= getPixelFormat().blueBits;

			scene.lines.swap(lines);
			scene.lineWidth = getLineWidth();

			iterationResult = verifyLineGroupInterpolation(resultImage, scene, args, m_testCtx.getLog());
			switch (iterationResult)
			{
				case tcu::LINEINTERPOLATION_STRICTLY_CORRECT:
					// line interpolation matches the specification
					m_result.addResult(QP_TEST_RESULT_PASS, "Pass");
					break;

				case tcu::LINEINTERPOLATION_PROJECTED:
					// line interpolation weights are otherwise correct, but they are projected onto major axis
					m_testCtx.getLog()	<< tcu::TestLog::Message
										<< "Interpolation was calculated using coordinates projected onto major axis. "
										"This method does not produce the same values as the non-projecting method defined in the specification."
										<< tcu::TestLog::EndMessage;
					m_result.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Interpolation was calculated using projected coordinateds");
					break;

				case tcu::LINEINTERPOLATION_INCORRECT:
					if (scene.lineWidth != 1.0f && m_numSamples > 1)
					{
						// multisampled wide lines might not be supported
						m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Interpolation of multisampled wide lines failed");
					}
					else
					{
						// line interpolation is incorrect
						m_result.addResult(QP_TEST_RESULT_FAIL, "Found invalid pixel values");
					}
					break;

				default:
					DE_ASSERT(false);
					break;
			}
		}
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		m_result.setTestContextResult(m_testCtx);
		return STOP;
	}
	else
		return CONTINUE;
}